

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlCatalogConvert(void)

{
  int iVar1;
  xmlCatalogPtr unaff_RBX;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  xmlRMutexLock(xmlCatalogMutex);
  iVar1 = xmlConvertSGMLCatalog(unaff_RBX);
  xmlRMutexUnlock(xmlCatalogMutex);
  return iVar1;
}

Assistant:

int
xmlCatalogConvert(void) {
    int res = -1;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    xmlRMutexLock(xmlCatalogMutex);
    res = xmlConvertSGMLCatalog(xmlDefaultCatalog);
    xmlRMutexUnlock(xmlCatalogMutex);
    return(res);
}